

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

CharPtr __thiscall
fmt::BasicWriter<char>::prepare_int_buffer<fmt::AlignSpec>
          (BasicWriter<char> *this,uint num_digits,AlignSpec *spec,char *prefix,uint prefix_size)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  Alignment AVar4;
  Buffer<char> *pBVar5;
  size_t sVar6;
  Buffer<char> *pBVar7;
  size_t size;
  char *__dest;
  char *pcVar8;
  uint uVar9;
  size_t __len_1;
  ulong uVar10;
  size_t __len;
  ulong uVar11;
  char __tmp;
  
  if ((int)num_digits < -1) {
    __assert_fail("(value >= 0) && \"negative value\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/octobanana[P]pine/src/format.h"
                  ,0x2c9,
                  "typename MakeUnsigned<Int>::Type fmt::internal::to_unsigned(Int) [Int = int]");
  }
  uVar11 = (ulong)num_digits;
  uVar3 = (spec->super_WidthSpec).width_;
  uVar10 = (ulong)uVar3;
  uVar9 = prefix_size + num_digits;
  pBVar5 = this->buffer_;
  sVar6 = pBVar5->size_;
  if (uVar3 <= uVar9) {
    uVar11 = sVar6 + uVar9;
    pBVar7 = pBVar5;
    if (pBVar5->capacity_ < uVar11) {
      (**pBVar5->_vptr_Buffer)(pBVar5,uVar11);
      pBVar7 = this->buffer_;
    }
    pBVar5->size_ = uVar11;
    pcVar8 = pBVar7->ptr_;
    if (prefix_size != 0) {
      memmove(pcVar8 + sVar6,prefix,(ulong)prefix_size);
    }
    pcVar8 = pcVar8 + sVar6 + uVar9;
    goto LAB_00123e46;
  }
  AVar4 = spec->align_;
  bVar2 = (byte)(spec->super_WidthSpec).fill_;
  uVar1 = sVar6 + uVar10;
  pBVar7 = pBVar5;
  if (pBVar5->capacity_ < uVar1) {
    (**pBVar5->_vptr_Buffer)(pBVar5,uVar1);
    pBVar7 = this->buffer_;
  }
  pBVar5->size_ = uVar1;
  __dest = pBVar7->ptr_ + sVar6;
  pcVar8 = __dest + uVar10;
  if (AVar4 == ALIGN_NUMERIC) {
    if (prefix_size == 0) {
LAB_00123ee6:
      uVar11 = (ulong)uVar9;
    }
    else {
      memmove(__dest,prefix,(ulong)prefix_size);
      __dest = __dest + prefix_size;
    }
  }
  else {
    if (AVar4 == ALIGN_CENTER) {
      uVar10 = uVar10 - uVar9;
      uVar11 = uVar10 >> 1;
      if (1 < uVar10) {
        memset(__dest,(uint)bVar2,uVar11);
      }
      pcVar8 = __dest + uVar11 + uVar9;
      memset(pcVar8,(uint)bVar2,uVar10 - uVar11);
      if (prefix_size != 0) {
        memmove(__dest + uVar11,prefix,(ulong)prefix_size);
      }
      goto LAB_00123e46;
    }
    if (AVar4 == ALIGN_LEFT) {
      if (prefix_size != 0) {
        memmove(__dest,prefix,(ulong)prefix_size);
      }
      pcVar8 = __dest + uVar9;
      memset(pcVar8,(uint)bVar2,uVar10 - uVar9);
      goto LAB_00123e46;
    }
    if (prefix_size == 0) goto LAB_00123ee6;
    uVar11 = (ulong)uVar9;
    memmove(pcVar8 + -(ulong)uVar9,prefix,(ulong)prefix_size);
  }
  if (pcVar8 + (-(long)__dest - uVar11) != (char *)0x0) {
    memset(__dest,(uint)bVar2,(size_t)(pcVar8 + (-(long)__dest - uVar11)));
  }
LAB_00123e46:
  return pcVar8 + -1;
}

Assistant:

typename BasicWriter<Char>::CharPtr
  BasicWriter<Char>::prepare_int_buffer(
    unsigned num_digits, const Spec &spec,
    const char *prefix, unsigned prefix_size) {
  unsigned width = spec.width();
  Alignment align = spec.align();
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  if (spec.precision() > static_cast<int>(num_digits)) {
    // Octal prefix '0' is counted as a digit, so ignore it if precision
    // is specified.
    if (prefix_size > 0 && prefix[prefix_size - 1] == '0')
      --prefix_size;
    unsigned number_size =
        prefix_size + internal::to_unsigned(spec.precision());
    AlignSpec subspec(number_size, '0', ALIGN_NUMERIC);
    if (number_size >= width)
      return prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
    buffer_.reserve(width);
    unsigned fill_size = width - number_size;
    if (align != ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    CharPtr result = prepare_int_buffer(
        num_digits, subspec, prefix, prefix_size);
    if (align == ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    return result;
  }
  unsigned size = prefix_size + num_digits;
  if (width <= size) {
    CharPtr p = grow_buffer(size);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    return p + size - 1;
  }
  CharPtr p = grow_buffer(width);
  CharPtr end = p + width;
  if (align == ALIGN_LEFT) {
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
    std::uninitialized_fill(p, end, fill);
  } else if (align == ALIGN_CENTER) {
    p = fill_padding(p, width, size, fill);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
  } else {
    if (align == ALIGN_NUMERIC) {
      if (prefix_size != 0) {
        p = std::uninitialized_copy(prefix, prefix + prefix_size, p);
        size -= prefix_size;
      }
    } else {
      std::uninitialized_copy(prefix, prefix + prefix_size, end - size);
    }
    std::uninitialized_fill(p, end - size, fill);
    p = end;
  }
  return p - 1;
}